

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O0

void __thiscall HostVector_copy_Test::TestBody(HostVector_copy_Test *this)

{
  bool bVar1;
  pointer pvVar2;
  char *message;
  AssertHelper local_c8;
  Message local_c0;
  float local_b4;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  value_type_conflict1 v;
  pointer __end1;
  pointer __begin1;
  vecN<float,_32> *__range1;
  vecN<float,_32> v32;
  ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
  local_48;
  undefined1 local_30 [8];
  vecN<float,_16> v16;
  HostVector_copy_Test *this_local;
  
  v16._24_8_ = this;
  memory::
  Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<16ul>>>>
  ::Array<int,void>((Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<16ul>>>>
                     *)local_30,100);
  memory::
  ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
  ::operator()(&local_48,
               (ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
                *)local_30);
  memory::
  ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
  ::operator=(&local_48,3.14);
  memory::
  ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
  ::~ArrayReference(&local_48);
  memory::
  Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>>
  ::
  Array<memory::Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<16ul>>>>&,void>
            ((Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>>
              *)&__range1,
             (Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
              *)local_30);
  __end1 = memory::
           ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>
           ::begin((ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>
                    *)&__range1);
  pvVar2 = memory::
           ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>
           ::end((ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>
                  *)&__range1);
  for (; __end1 != pvVar2; __end1 = __end1 + 1) {
    gtest_ar.message_.ptr_._4_4_ = *__end1;
    local_b4 = 3.14;
    testing::internal::EqHelper<false>::Compare<float,float>
              ((EqHelper<false> *)local_b0,"v","3.14f",(float *)((long)&gtest_ar.message_.ptr_ + 4),
               &local_b4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
    if (!bVar1) {
      testing::Message::Message(&local_c0);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
                 ,0x61,message);
      testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      testing::Message::~Message(&local_c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  }
  memory::
  Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>
  ::~Array((Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>
            *)&__range1);
  memory::
  Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
  ::~Array((Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
            *)local_30);
  return;
}

Assistant:

TEST(HostVector, copy) {
    using namespace memory;

    vecN<float, 16> v16(100);
    v16(memory::all) = 3.14f;
    vecN<float, 32> v32 = v16;

    for(auto v: v32) {
        EXPECT_EQ(v, 3.14f);
    }
}